

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::BackgroundRescan(Recycler *this,RescanFlags rescanFlags)

{
  int iVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  
  if (this->isProcessingRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x110b,"(!this->isProcessingRescan)","!this->isProcessingRescan");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this->isProcessingRescan = true;
  if (DAT_015bf41e == '\x01') {
    CCLock::Enter((CCLock *)&this->pendingWriteBarrierBlockMap);
    uVar5 = (this->pendingWriteBarrierBlockMap).bucketCount;
    if (uVar5 != 0) {
      uVar9 = 0;
      do {
        iVar10 = (this->pendingWriteBarrierBlockMap).buckets[uVar9];
        if (iVar10 != -1) {
          do {
            pSVar2 = (this->pendingWriteBarrierBlockMap).entries;
            iVar1 = pSVar2[iVar10].
                    super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<void_*,_unsigned_long>.
                    super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                    .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.next;
            RecyclerWriteBarrierManager::WriteBarrier
                      (pSVar2[iVar10].
                       super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<void_*,_unsigned_long>.
                       super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                       .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.key,
                       pSVar2[iVar10].
                       super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<void_*,_unsigned_long>.
                       super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                       .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.value);
            iVar10 = iVar1;
          } while (iVar1 != -1);
          uVar5 = (this->pendingWriteBarrierBlockMap).bucketCount;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar5);
    }
    CCLock::Leave((CCLock *)&this->pendingWriteBarrierBlockMap);
  }
  uVar6 = HeapBlockMap64::Rescan(&this->heapBlockMap,this,(bool)((byte)rescanFlags & 1));
  sVar8 = HeapInfoManager::Rescan(&this->autoHeap,rescanFlags);
  this->backgroundRescanCount = this->backgroundRescanCount + '\x01';
  sVar8 = sVar8 + uVar6;
  if ((((byte)rescanFlags | this->needOOMRescan) & 1) != 0) {
    if (this->needOOMRescan != false) {
      sVar8 = 0xffffffffffffffff;
    }
    this->isProcessingRescan = false;
  }
  return sVar8;
}

Assistant:

size_t
Recycler::BackgroundRescan(RescanFlags rescanFlags)
{
    Assert(!this->isProcessingRescan);

    DebugOnly(this->isProcessingRescan = true);

    GCETW(GC_BACKGROUNDRESCAN_START, (this, backgroundRescanCount));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundRescanPhase);

#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        pendingWriteBarrierBlockMap.LockResize();
        pendingWriteBarrierBlockMap.Map([](void* address, size_t size)
        {
            RecyclerWriteBarrierManager::WriteBarrier(address, size);
        });
        pendingWriteBarrierBlockMap.UnlockResize();
    }
#endif

    size_t rescannedPageCount = heapBlockMap.Rescan(this, ((rescanFlags & RescanFlags_ResetWriteWatch) != 0));

    rescannedPageCount += autoHeap.Rescan(rescanFlags);

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundRescanPhase);
    GCETW(GC_BACKGROUNDRESCAN_STOP, (this, backgroundRescanCount));
    this->backgroundRescanCount++;

    if (!this->NeedOOMRescan())
    {
        if ((rescanFlags & RescanFlags_ResetWriteWatch) != 0)
        {
            DebugOnly(this->isProcessingRescan = false);
        }

        return rescannedPageCount;
    }

    DebugOnly(this->isProcessingRescan = false);

    return Recycler::InvalidScanRootBytes;
}